

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_formatter.cpp
# Opt level: O0

string * lwlog::details::alignment_formatter::align_center
                   (string *__return_storage_ptr__,string *to_align,uint8_t width,char fill_char)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  size_type padding_right;
  size_type padding_left;
  size_type total_padding;
  char fill_char_local;
  uint8_t width_local;
  string *to_align_local;
  string *result;
  
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < width) {
    lVar3 = std::__cxx11::string::size();
    cVar1 = (char)((ulong)width - lVar3 >> 1);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    std::__cxx11::string::append((ulong)__return_storage_ptr__,cVar1);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((ulong)__return_storage_ptr__,(char)((ulong)width - lVar3) - cVar1)
    ;
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)to_align);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string alignment_formatter::align_center(const std::string& to_align, std::uint8_t width, char fill_char)
	{
		if (width <= to_align.size()) return to_align;

		const auto total_padding{ width - to_align.size()		};
		const auto padding_left	{ total_padding / 2				};
		const auto padding_right{ total_padding - padding_left	};

		std::string result;
		result.reserve(width);

		result.append(padding_left, fill_char);
		result.append(to_align);
		result.append(padding_right, fill_char);

		return result;
	}